

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::DefinitionSymbol::DefinitionSymbol
          (DefinitionSymbol *this,Scope *scope,LookupLocation lookupLocation,
          ModuleDeclarationSyntax *syntax,NetType *defaultNetType,UnconnectedDrive unconnectedDrive,
          bool cellDefine,optional<slang::TimeScale> directiveTimeScale,SyntaxTree *syntaxTree)

{
  long lVar1;
  group_type_pointer pgVar2;
  SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *results;
  flat_hash_set<std::string_view> *arrays_;
  SyntaxKind SVar3;
  PortListSyntax *pPVar4;
  ParameterPortListSyntax *syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  Token token;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  optional<slang::SourceRange> unitsRange_00;
  optional<slang::SourceRange> precisionRange_00;
  ulong uVar5;
  ulong uVar6;
  value_type_pointer pbVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  size_t __n;
  long lVar24;
  value_type_pointer pbVar25;
  ulong uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  DefinitionKind DVar43;
  int iVar44;
  SourceLocation SVar45;
  SourceLibrary *pSVar46;
  optional<slang::ast::VariableLifetime> oVar47;
  SyntaxNode *pSVar48;
  Diagnostic *this_00;
  byte *pbVar49;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar50;
  uint64_t hash;
  _Storage<slang::ast::VariableLifetime,_true> _Var51;
  uint uVar52;
  size_t sVar53;
  value_type_pointer pbVar54;
  group_type_pointer pgVar55;
  ModuleHeaderSyntax *pMVar56;
  pointer ppMVar57;
  ulong uVar58;
  ulong uVar59;
  ulong pos0;
  ulong uVar60;
  ulong uVar61;
  pointer ppMVar62;
  TimeUnitsDeclarationSyntax *syntax_02;
  bool bVar63;
  bool bVar64;
  undefined1 auVar65 [16];
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  uchar uVar69;
  uchar uVar70;
  uchar uVar71;
  uchar uVar72;
  uchar uVar73;
  uchar uVar74;
  uchar uVar75;
  uchar uVar76;
  uchar uVar77;
  uchar uVar78;
  uchar uVar79;
  uchar uVar80;
  uchar uVar81;
  string_view sVar82;
  SourceRange sourceRange;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  locator res;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe90;
  long local_138;
  string_view local_120;
  DefinitionSymbol *local_110;
  TimeScale *local_108;
  ulong local_100;
  uint64_t local_f8;
  size_t *local_f0;
  ParameterPortListSyntax *local_e8;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  size_t local_c8;
  ulong local_c0;
  value_type_pointer local_b8;
  group_type_pointer local_b0;
  pointer local_a8;
  ulong local_a0;
  TimeUnitsDeclarationSyntax *local_98;
  char *local_90;
  _Storage<slang::SourceRange,_true> local_88;
  undefined1 local_78;
  undefined7 uStack_77;
  _Storage<slang::SourceRange,_true> local_70;
  undefined1 local_60;
  undefined7 uStack_5f;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  locator local_48;
  
  sVar82 = parsing::Token::valueText(&((syntax->header).ptr)->name);
  SVar45 = parsing::Token::location(&((syntax->header).ptr)->name);
  (this->super_Symbol).kind = Definition;
  (this->super_Symbol).name = sVar82;
  (this->super_Symbol).location = SVar45;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  this->defaultNetType = defaultNetType;
  this->unconnectedDrive = unconnectedDrive;
  this->cellDefine = cellDefine;
  (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_ =
       (pointer)(this->parameters).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.firstElement;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len = 0;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.cap = 8;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_mask = 1;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  sVar53 = 0x1d;
  if ((this->modports).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar53 = 0;
  }
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.ml = sVar53;
  *(undefined1 (*) [16])
   &(this->modports).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  (this->bindDirectives).
  super__Vector_base<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->syntaxTree = syntaxTree;
  if ((syntaxTree == (SyntaxTree *)0x0) ||
     (pSVar46 = syntaxTree->library, pSVar46 == (SourceLibrary *)0x0)) {
    pSVar46 = scope->compilation->defaultLibPtr;
  }
  results = &this->parameters;
  this->sourceLibrary = pSVar46;
  this->instanceCount = 0;
  (this->super_Symbol).parentScope = scope;
  (this->super_Symbol).indexInScope = lookupLocation.index;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_01._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_01._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_01);
  DVar43 = SemanticFacts::getDefinitionKind((syntax->super_MemberSyntax).super_SyntaxNode.kind);
  this->definitionKind = DVar43;
  pMVar56 = (syntax->header).ptr;
  token.kind = (pMVar56->lifetime).kind;
  token._2_1_ = (pMVar56->lifetime).field_0x2;
  token.numFlags.raw = (pMVar56->lifetime).numFlags.raw;
  token.rawLen = (pMVar56->lifetime).rawLen;
  token.info = (pMVar56->lifetime).info;
  oVar47 = SemanticFacts::getVariableLifetime(token);
  _Var51._M_value = Static;
  if (((ulong)oVar47.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::VariableLifetime> >> 0x20 & 1) != 0) {
    _Var51._M_value =
         oVar47.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::VariableLifetime>._M_payload;
  }
  this->defaultLifetime = (VariableLifetime)_Var51;
  pMVar56 = (syntax->header).ptr;
  if ((pMVar56->ports != (PortListSyntax *)0x0) &&
     ((pMVar56->ports->super_SyntaxNode).kind == WildcardPortList)) {
    pSVar48 = Compilation::getExternDefinition(scope->compilation,(this->super_Symbol).name,scope);
    if ((pSVar48 == (SyntaxNode *)0x0) || (pSVar48->kind != ExternModuleDecl)) {
      if ((this->super_Symbol).name._M_len != 0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(&pMVar56->ports->super_SyntaxNode);
        this_00 = Scope::addDiag(scope,(DiagCode)0x7d0006,sourceRange);
        Diagnostic::operator<<(this_00,(this->super_Symbol).name);
      }
    }
    else {
      pMVar56 = (ModuleHeaderSyntax *)pSVar48[6].parent;
    }
  }
  pPVar4 = pMVar56->ports;
  this->portList = pPVar4;
  if (pPVar4 == (PortListSyntax *)0x0) {
    bVar63 = false;
  }
  else {
    bVar63 = (pPVar4->super_SyntaxNode).kind == NonAnsiPortList;
  }
  this->hasNonAnsiPorts = bVar63;
  syntax_00 = pMVar56->parameters;
  if (syntax_00 != (ParameterPortListSyntax *)0x0) {
    ParameterBuilder::createDecls
              (scope,syntax_00,
               &results->super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>);
  }
  local_108 = (TimeScale *)&this->timeScale;
  local_60 = 0;
  local_78 = 0;
  sVar53 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
           _M_extent._M_extent_value;
  local_e8 = syntax_00;
  if (sVar53 != 0) {
    arrays_ = &this->modports;
    local_f0 = &(this->modports).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.size;
    ppMVar57 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
               _M_ptr;
    ppMVar62 = ppMVar57 + sVar53;
    bVar63 = true;
    local_110 = this;
    local_a8 = ppMVar62;
    do {
      syntax_02 = (TimeUnitsDeclarationSyntax *)*ppMVar57;
      SVar3 = (syntax_02->super_MemberSyntax).super_SyntaxNode.kind;
      if (SVar3 == ModportDeclaration) {
        pbVar49 = (byte *)((long)&(syntax_02[1].super_MemberSyntax.super_SyntaxNode.parent)->kind +
                          1);
        if (pbVar49 < (byte *)0x2) {
LAB_0078676b:
          bVar63 = false;
        }
        else {
          local_a0 = (ulong)pbVar49 >> 1;
          uVar58 = 0;
          local_98 = syntax_02;
          do {
            ppSVar50 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)(uVar58 * 0x30 +
                                     *(long *)&syntax_02[1].super_MemberSyntax.super_SyntaxNode));
            local_120 = parsing::Token::valueText((Token *)(*ppSVar50 + 1));
            hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              arrays_,&local_120);
            pos0 = hash >> ((byte)(this->modports).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                  .arrays.groups_size_index & 0x3f);
            pgVar55 = (this->modports).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                      .arrays.groups_;
            lVar1 = (hash & 0xff) * 4;
            uVar66 = (&UNK_009584ac)[lVar1];
            uVar67 = (&UNK_009584ad)[lVar1];
            uVar68 = (&UNK_009584ae)[lVar1];
            uVar69 = (&UNK_009584af)[lVar1];
            __n = local_120._M_len;
            local_90 = local_120._M_str;
            uVar59 = (ulong)((uint)hash & 7);
            sVar53 = (this->modports).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                     .arrays.groups_size_mask;
            uVar61 = 0;
            pbVar54 = (this->modports).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                      .arrays.elements_;
            uVar60 = pos0;
            uVar70 = uVar66;
            uVar71 = uVar67;
            uVar72 = uVar68;
            uVar73 = uVar69;
            uVar74 = uVar66;
            uVar75 = uVar67;
            uVar76 = uVar68;
            uVar77 = uVar69;
            uVar78 = uVar66;
            uVar79 = uVar67;
            uVar80 = uVar68;
            uVar81 = uVar69;
            do {
              pgVar2 = pgVar55 + uVar60;
              auVar65[0] = -(pgVar2->m[0].n == uVar66);
              auVar65[1] = -(pgVar2->m[1].n == uVar67);
              auVar65[2] = -(pgVar2->m[2].n == uVar68);
              auVar65[3] = -(pgVar2->m[3].n == uVar69);
              auVar65[4] = -(pgVar2->m[4].n == uVar70);
              auVar65[5] = -(pgVar2->m[5].n == uVar71);
              auVar65[6] = -(pgVar2->m[6].n == uVar72);
              auVar65[7] = -(pgVar2->m[7].n == uVar73);
              auVar65[8] = -(pgVar2->m[8].n == uVar74);
              auVar65[9] = -(pgVar2->m[9].n == uVar75);
              auVar65[10] = -(pgVar2->m[10].n == uVar76);
              auVar65[0xb] = -(pgVar2->m[0xb].n == uVar77);
              auVar65[0xc] = -(pgVar2->m[0xc].n == uVar78);
              auVar65[0xd] = -(pgVar2->m[0xd].n == uVar79);
              auVar65[0xe] = -(pgVar2->m[0xe].n == uVar80);
              auVar65[0xf] = -(pgVar2->m[0xf].n == uVar81);
              lVar24 = uVar60 * 0x10;
              pbVar25 = pbVar54;
              uVar26 = uVar60;
              uVar27 = uVar66;
              uVar28 = uVar67;
              uVar29 = uVar68;
              uVar30 = uVar69;
              uVar31 = uVar70;
              uVar32 = uVar71;
              uVar33 = uVar72;
              uVar34 = uVar73;
              uVar35 = uVar74;
              uVar36 = uVar75;
              uVar37 = uVar76;
              uVar38 = uVar77;
              uVar39 = uVar78;
              uVar40 = uVar79;
              uVar41 = uVar80;
              uVar42 = uVar81;
              lVar1 = local_e0;
              uVar5 = local_d8;
              uVar6 = local_d0;
              pbVar7 = local_b8;
              uVar8 = local_58;
              uVar9 = uStack_57;
              uVar10 = uStack_56;
              uVar11 = uStack_55;
              uVar12 = uStack_54;
              uVar13 = uStack_53;
              uVar14 = uStack_52;
              uVar15 = uStack_51;
              uVar16 = uStack_50;
              uVar17 = uStack_4f;
              uVar18 = uStack_4e;
              uVar19 = uStack_4d;
              uVar20 = uStack_4c;
              uVar21 = uStack_4b;
              uVar22 = uStack_4a;
              uVar23 = uStack_49;
              for (uVar52 = (uint)(ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe);
                  uStack_49 = uVar42, uStack_4a = uVar41, uStack_4b = uVar40, uStack_4c = uVar39,
                  uStack_4d = uVar38, uStack_4e = uVar37, uStack_4f = uVar36, uStack_50 = uVar35,
                  uStack_51 = uVar34, uStack_52 = uVar33, uStack_53 = uVar32, uStack_54 = uVar31,
                  uStack_55 = uVar30, uStack_56 = uVar29, uStack_57 = uVar28, local_58 = uVar27,
                  local_d8 = uVar61, local_d0 = uVar26, local_b8 = pbVar25, local_e0 = lVar24,
                  uVar52 != 0; uVar52 = uVar52 - 1 & uVar52) {
                iVar44 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> iVar44 & 1) == 0; iVar44 = iVar44 + 1) {
                  }
                }
                bVar63 = __n == *(size_t *)
                                 ((long)&pbVar54[uVar60 * 0xf]._M_len + (ulong)(uint)(iVar44 << 4));
                local_138 = (long)&pbVar54[uVar60 * 0xf]._M_len + (ulong)(uint)(iVar44 << 4);
                local_100 = pos0;
                local_f8 = hash;
                local_c8 = sVar53;
                local_c0 = uVar59;
                local_b0 = pgVar55;
                if (bVar63 && __n != 0) {
                  iVar44 = bcmp(local_90,*(void **)(local_138 + 8),__n);
                  bVar63 = iVar44 == 0;
                  uVar66 = local_58;
                  uVar67 = uStack_57;
                  uVar68 = uStack_56;
                  uVar69 = uStack_55;
                  uVar70 = uStack_54;
                  uVar71 = uStack_53;
                  uVar72 = uStack_52;
                  uVar73 = uStack_51;
                  uVar74 = uStack_50;
                  uVar75 = uStack_4f;
                  uVar76 = uStack_4e;
                  uVar77 = uStack_4d;
                  uVar78 = uStack_4c;
                  uVar79 = uStack_4b;
                  uVar80 = uStack_4a;
                  uVar81 = uStack_49;
                }
                hash = local_f8;
                pos0 = local_100;
                this = local_110;
                if (bVar63) goto LAB_007869b3;
                lVar24 = local_e0;
                pbVar25 = local_b8;
                pgVar55 = local_b0;
                uVar59 = local_c0;
                sVar53 = local_c8;
                uVar26 = local_d0;
                uVar61 = local_d8;
                uVar27 = local_58;
                uVar28 = uStack_57;
                uVar29 = uStack_56;
                uVar30 = uStack_55;
                uVar31 = uStack_54;
                uVar32 = uStack_53;
                uVar33 = uStack_52;
                uVar34 = uStack_51;
                uVar35 = uStack_50;
                uVar36 = uStack_4f;
                uVar37 = uStack_4e;
                uVar38 = uStack_4d;
                uVar39 = uStack_4c;
                uVar40 = uStack_4b;
                uVar41 = uStack_4a;
                uVar42 = uStack_49;
                lVar1 = local_e0;
                uVar5 = local_d8;
                uVar6 = local_d0;
                pbVar7 = local_b8;
                uVar8 = local_58;
                uVar9 = uStack_57;
                uVar10 = uStack_56;
                uVar11 = uStack_55;
                uVar12 = uStack_54;
                uVar13 = uStack_53;
                uVar14 = uStack_52;
                uVar15 = uStack_51;
                uVar16 = uStack_50;
                uVar17 = uStack_4f;
                uVar18 = uStack_4e;
                uVar19 = uStack_4d;
                uVar20 = uStack_4c;
                uVar21 = uStack_4b;
                uVar22 = uStack_4a;
                uVar23 = uStack_49;
              }
              local_58 = uVar8;
              uStack_57 = uVar9;
              uStack_56 = uVar10;
              uStack_55 = uVar11;
              uStack_54 = uVar12;
              uStack_53 = uVar13;
              uStack_52 = uVar14;
              uStack_51 = uVar15;
              uStack_50 = uVar16;
              uStack_4f = uVar17;
              uStack_4e = uVar18;
              uStack_4d = uVar19;
              uStack_4c = uVar20;
              uStack_4b = uVar21;
              uStack_4a = uVar22;
              uStack_49 = uVar23;
              if ((pgVar55->m[local_e0 + 0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[uVar59]) == 0) break;
              uVar61 = local_d8 + 1;
              uVar60 = local_d0 + local_d8 + 1 & sVar53;
              pbVar54 = local_b8;
              local_e0 = lVar1;
              local_d8 = uVar5;
              local_d0 = uVar6;
              local_b8 = pbVar7;
            } while (uVar61 <= sVar53);
            local_138 = 0;
            local_e0 = lVar1;
            local_d8 = uVar5;
            local_d0 = uVar6;
            local_b8 = pbVar7;
LAB_007869b3:
            syntax_02 = local_98;
            ppMVar62 = local_a8;
            if (local_138 == 0) {
              if ((this->modports).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .size_ctrl.size <
                  (this->modports).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_48,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_120);
                *local_f0 = *local_f0 + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_48,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)arrays_,hash,&local_120);
              }
            }
            uVar58 = uVar58 + 1;
            bVar63 = false;
          } while (uVar58 != local_a0);
        }
      }
      else if (SVar3 == ParameterDeclarationStatement) {
        bVar64 = true;
        if (local_e8 == (ParameterPortListSyntax *)0x0) {
          bVar64 = *(short *)&(*(Scope **)&syntax_02->keyword)->firstMember == 0xd2;
        }
        bVar63 = false;
        attributes._M_extent._M_extent_value = in_stack_fffffffffffffe90._M_extent_value;
        attributes._M_ptr = (pointer)results;
        ParameterBuilder::createDecls
                  ((ParameterBuilder *)scope,*(Scope **)&syntax_02->keyword,
                   (ParameterDeclarationBaseSyntax *)(ulong)bVar64,false,
                   SUB81((syntax_02->super_MemberSyntax).attributes.
                         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                         ._M_ptr,0),attributes,
                   (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)
                   (syntax_02->super_MemberSyntax).attributes.
                   super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                   _M_extent._M_extent_value);
      }
      else {
        if (SVar3 != TimeUnitsDeclaration) goto LAB_0078676b;
        if ((this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
          (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_payload =
               (_Storage<slang::TimeScale,_true>)0x1030103;
          (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
        }
        SemanticFacts::populateTimeScale
                  (local_108,scope,syntax_02,(optional<slang::SourceRange> *)&local_70._M_value,
                   (optional<slang::SourceRange> *)&local_88._M_value,bVar63);
      }
      ppMVar57 = ppMVar57 + 1;
    } while (ppMVar57 != ppMVar62);
  }
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_77;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = (bool)local_78;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_5f;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = (bool)local_60;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       local_70._M_value.endLoc;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       local_70._M_value.startLoc;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       local_88._M_value.endLoc;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       local_88._M_value.startLoc;
  SemanticFacts::populateTimeScale
            ((optional<slang::TimeScale> *)local_108,scope,directiveTimeScale,unitsRange_00,
             precisionRange_00);
  return;
}

Assistant:

DefinitionSymbol::DefinitionSymbol(const Scope& scope, LookupLocation lookupLocation,
                                   const ModuleDeclarationSyntax& syntax,
                                   const NetType& defaultNetType, UnconnectedDrive unconnectedDrive,
                                   bool cellDefine, std::optional<TimeScale> directiveTimeScale,
                                   const SyntaxTree* syntaxTree) :
    Symbol(SymbolKind::Definition, syntax.header->name.valueText(), syntax.header->name.location()),
    defaultNetType(defaultNetType), unconnectedDrive(unconnectedDrive), cellDefine(cellDefine),
    syntaxTree(syntaxTree), sourceLibrary(getLibForDef(scope, syntaxTree)) {

    // Extract and save various properties of the definition.
    setParent(scope, lookupLocation.getIndex());
    setSyntax(syntax);
    setAttributes(scope, syntax.attributes);

    definitionKind = SemanticFacts::getDefinitionKind(syntax.kind);
    defaultLifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime)
                          .value_or(VariableLifetime::Static);

    auto header = syntax.header.get();
    if (header->ports && header->ports->kind == SyntaxKind::WildcardPortList) {
        auto& comp = scope.getCompilation();
        auto externMod = comp.getExternDefinition(name, scope);
        if (externMod && externMod->kind == SyntaxKind::ExternModuleDecl)
            header = externMod->as<ExternModuleDeclSyntax>().header;
        else if (!name.empty())
            scope.addDiag(diag::MissingExternWildcardPorts, header->ports->sourceRange()) << name;
    }

    portList = header->ports;
    hasNonAnsiPorts = portList && portList->kind == SyntaxKind::NonAnsiPortList;

    // Find all port parameters.
    bool hasPortParams = header->parameters != nullptr;
    if (hasPortParams)
        ParameterBuilder::createDecls(scope, *header->parameters, parameters);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            if (!timeScale)
                timeScale.emplace();

            SemanticFacts::populateTimeScale(*timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;
        if (member->kind == SyntaxKind::ModportDeclaration) {
            for (auto item : member->as<ModportDeclarationSyntax>().items)
                modports.emplace(item->name.valueText());
        }
        else if (member->kind == SyntaxKind::ParameterDeclarationStatement) {
            auto declaration = member->as<ParameterDeclarationStatementSyntax>().parameter;
            bool isLocal = hasPortParams ||
                           declaration->keyword.kind == TokenKind::LocalParamKeyword;

            ParameterBuilder::createDecls(scope, *declaration, isLocal, /* isPort */ false,
                                          member->attributes, parameters);
        }
    }

    SemanticFacts::populateTimeScale(timeScale, scope, directiveTimeScale, unitsRange,
                                     precisionRange);
}